

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::BeginDragDropTarget(void)

{
  ImGuiWindow *this;
  ImGuiContext *pIVar1;
  ImRect *local_38;
  ImGuiID local_2c;
  ImGuiID id;
  ImRect *display_rect;
  ImGuiWindow *window;
  ImGuiContext *g;
  
  pIVar1 = GImGui;
  if ((GImGui->DragDropActive & 1U) == 0) {
    g._7_1_ = false;
  }
  else {
    this = GImGui->CurrentWindow;
    if (((this->DC).LastItemStatusFlags & 1U) == 0) {
      g._7_1_ = false;
    }
    else if ((GImGui->HoveredWindow == (ImGuiWindow *)0x0) ||
            (this->RootWindow != GImGui->HoveredWindow->RootWindow)) {
      g._7_1_ = false;
    }
    else {
      if (((this->DC).LastItemStatusFlags & 2U) == 0) {
        local_38 = &(this->DC).LastItemRect;
      }
      else {
        local_38 = &(this->DC).LastItemDisplayRect;
      }
      local_2c = (this->DC).LastItemId;
      if (local_2c == 0) {
        local_2c = ImGuiWindow::GetIDFromRectangle(this,local_38);
      }
      if ((pIVar1->DragDropPayload).SourceId == local_2c) {
        g._7_1_ = false;
      }
      else {
        if ((pIVar1->DragDropWithinTarget & 1U) != 0) {
          __assert_fail("g.DragDropWithinTarget == false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui.cpp"
                        ,0x2420,"bool ImGui::BeginDragDropTarget()");
        }
        (pIVar1->DragDropTargetRect).Min = local_38->Min;
        (pIVar1->DragDropTargetRect).Max = local_38->Max;
        pIVar1->DragDropTargetId = local_2c;
        pIVar1->DragDropWithinTarget = true;
        g._7_1_ = true;
      }
    }
  }
  return g._7_1_;
}

Assistant:

bool ImGui::BeginDragDropTarget()
{
    ImGuiContext& g = *GImGui;
    if (!g.DragDropActive)
        return false;

    ImGuiWindow* window = g.CurrentWindow;
    if (!(window->DC.LastItemStatusFlags & ImGuiItemStatusFlags_HoveredRect))
        return false;
    if (g.HoveredWindow == NULL || window->RootWindow != g.HoveredWindow->RootWindow)
        return false;

    const ImRect& display_rect = (window->DC.LastItemStatusFlags & ImGuiItemStatusFlags_HasDisplayRect) ? window->DC.LastItemDisplayRect : window->DC.LastItemRect;
    ImGuiID id = window->DC.LastItemId;
    if (id == 0)
        id = window->GetIDFromRectangle(display_rect);
    if (g.DragDropPayload.SourceId == id)
        return false;

    IM_ASSERT(g.DragDropWithinTarget == false);
    g.DragDropTargetRect = display_rect;
    g.DragDropTargetId = id;
    g.DragDropWithinTarget = true;
    return true;
}